

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_tables.cpp
# Opt level: O2

u16 __thiscall YAJLHuffmanTable::HFTree::decode(HFTree *this,bitio_stream *bstream)

{
  HFNode *pHVar1;
  uint8_t uVar2;
  uint64_t uVar3;
  ssize_t sVar4;
  size_t in_RCX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *__buf;
  HFNode *pHVar5;
  
  pHVar5 = (HFNode *)this;
  while ((pHVar1 = pHVar5->left, pHVar1->left != (HFNode *)0x0 && (pHVar1->right != (HFNode *)0x0)))
  {
    uVar3 = bitio::bitio_stream::peek(bstream,'\b');
    __buf = extraout_RDX;
    if ((uVar3 == 0xff) &&
       (uVar3 = bitio::bitio_stream::peek(bstream,'\x10'), __buf = extraout_RDX_00, uVar3 == 0xff00)
       ) {
      this->count_bstuff = true;
      this->bstuff_count = '\0';
    }
    uVar2 = this->bstuff_count;
    if (this->count_bstuff == true) {
      uVar2 = uVar2 + '\x01';
      this->bstuff_count = uVar2;
    }
    if (uVar2 == '\b') {
      this->count_bstuff = false;
      this->bstuff_count = '\0';
      bitio::bitio_stream::skip(bstream,8);
      __buf = extraout_RDX_01;
    }
    sVar4 = bitio::bitio_stream::read(bstream,1,__buf,in_RCX);
    pHVar5 = (HFNode *)&pHVar1->right;
    if (sVar4 == 0) {
      pHVar5 = pHVar1;
    }
  }
  return (u16)pHVar1->symbol;
}

Assistant:

u16 YAJLHuffmanTable::HFTree::decode(bitio::bitio_stream *bstream) {
    auto *curr = root;
    while (curr->left != nullptr && curr->right != nullptr) {
        if (bstream->peek(0x8) == 0xFF) {
            auto pkval = bstream->peek(0x10);
            if (pkval == 0xFF00) {
                count_bstuff = true;
                bstuff_count = 0;
            }
        }

        if (count_bstuff) {
            bstuff_count++;
        }
        if (bstuff_count == 8) {
            bstuff_count = 0;
            count_bstuff = false;
            bstream->skip(0x8);
        }

        bool msb = bstream->read(0x1);
        if (msb) {
            curr = curr->right;
        } else {
            curr = curr->left;
        }
    }
    return curr->symbol;
}